

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.h
# Opt level: O2

void __thiscall Js::FunctionBody::InitDisableInlineSpread(FunctionBody *this)

{
  uint sourceContextId;
  bool bVar1;
  LocalFunctionId LVar2;
  uint uVar3;
  
  LVar2 = FunctionProxy::GetLocalFunctionId((FunctionProxy *)this);
  if (LVar2 == 0xffffffff) {
    uVar3 = 0;
  }
  else {
    sourceContextId =
         ((((((this->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr)->
            m_srcInfo).ptr)->sourceContextInfo).ptr)->sourceContextId;
    LVar2 = FunctionProxy::GetLocalFunctionId((FunctionProxy *)this);
    bVar1 = Phases::IsEnabled((Phases *)&DAT_01441eb0,InlinePhase,sourceContextId,LVar2);
    uVar3 = (uint)bVar1 << 0xd;
  }
  *(uint *)&this->field_0x178 = *(uint *)&this->field_0x178 & 0xffffdfff | uVar3;
  return;
}

Assistant:

void InitDisableInlineSpread()        { disableInlineSpread = this->GetLocalFunctionId() != Js::Constants::NoFunctionId && PHASE_OFF(Js::InlinePhase, this); }